

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

Vec_Str_t *
Abc_SclProduceGenlibStrProfile
          (SC_Lib *p,Mio_Library_t *pLib,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  SC_Cell *pRepr;
  undefined8 *puVar4;
  size_t sVar5;
  SC_Lib *__size;
  int iVar6;
  long lVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  Mio_Gate_t *pGate;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  SC_Cell *pSVar13;
  long lVar14;
  SC_Lib *p_00;
  int iVar15;
  SC_Cell *pCell;
  void *pvVar16;
  int i_1;
  int i;
  int iVar17;
  SC_Lib *pSVar18;
  int i_3;
  ulong uVar19;
  long lVar20;
  float fVar21;
  char Buffer [200];
  SC_Lib local_f8;
  
  lVar7 = (long)(p->vCellClasses).nSize;
  iVar17 = 0;
  iVar6 = 0;
  if (0 < lVar7) {
    lVar14 = 0;
    iVar6 = 0;
    do {
      pvVar3 = (p->vCellClasses).pArray[lVar14];
      if (*(int *)((long)pvVar3 + 0x44) == 1) {
        iVar15 = 0;
        pvVar16 = pvVar3;
        do {
          iVar15 = iVar15 + (uint)(*(int *)((long)pvVar16 + 0xc) == 0);
          pvVar16 = *(void **)((long)pvVar16 + 0x48);
        } while (pvVar16 != pvVar3);
        if (iVar6 <= iVar15) {
          iVar6 = iVar15;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar7);
  }
  iVar15 = 0;
  if (nGatesMin < iVar6) {
    iVar15 = nGatesMin;
  }
  Abc_SclMarkSkippedCells(p);
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pcVar9 = (char *)malloc(1000);
  pVVar8->pArray = pcVar9;
  lVar7 = 0;
  while( true ) {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar7];
    if (iVar17 == pVVar8->nCap) {
      if (iVar17 < 0x10) {
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = 0x10;
      }
      else {
        uVar2 = iVar17 * 2;
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,(ulong)uVar2);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = uVar2;
      }
    }
    else {
      pcVar9 = pVVar8->pArray;
    }
    iVar17 = pVVar8->nSize;
    pVVar8->nSize = iVar17 + 1;
    pcVar9[iVar17] = cVar1;
    if (lVar7 == 0x27) break;
    iVar17 = pVVar8->nSize;
    lVar7 = lVar7 + 1;
  }
  lVar7 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar7];
    uVar2 = pVVar8->nSize;
    if (uVar2 == pVVar8->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = 0x10;
      }
      else {
        sVar10 = (ulong)uVar2 * 2;
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar10);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = (int)sVar10;
      }
    }
    else {
      pcVar9 = pVVar8->pArray;
    }
    iVar17 = pVVar8->nSize;
    pVVar8->nSize = iVar17 + 1;
    pcVar9[iVar17] = cVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x28);
  if (nGatesMin == 0) {
    iVar15 = nGatesMin;
  }
  if ((p->vCells).nSize < 1) {
    iVar17 = 2;
  }
  else {
    iVar17 = 2;
    lVar7 = 0;
    do {
      pRepr = (SC_Cell *)(p->vCells).pArray[lVar7];
      iVar6 = pRepr->n_inputs;
      if ((iVar6 != 0) && (pRepr->n_outputs < 2)) {
        if ((iVar15 != 0) && (2 < iVar6)) {
          iVar12 = 0;
          pSVar13 = pRepr;
          do {
            iVar12 = iVar12 + (uint)(pSVar13->fSkip == 0);
            pSVar13 = pSVar13->pNext;
          } while (pSVar13 != pRepr);
          if (iVar12 < iVar15) goto LAB_003f3e30;
        }
        if ((iVar6 < 2) ||
           ((pGate = Mio_LibraryReadGateByName(pLib,pRepr->pName,(char *)0x0),
            pGate != (Mio_Gate_t *)0x0 && (iVar6 = Mio_GateReadProfile(pGate), iVar6 != 0)))) {
          sVar10 = strlen(pRepr->pName);
          if (199 < sVar10) {
            __assert_fail("strlen(pRepr->pName) < 200",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                          ,0x3c3,
                          "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                         );
          }
          lVar14 = 0;
          do {
            cVar1 = "GATE "[lVar14];
            uVar2 = pVVar8->nSize;
            if (uVar2 == pVVar8->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar8->pArray == (char *)0x0) {
                  pcVar9 = (char *)malloc(0x10);
                }
                else {
                  pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
                }
                pVVar8->pArray = pcVar9;
                pVVar8->nCap = 0x10;
              }
              else {
                sVar10 = (ulong)uVar2 * 2;
                if (pVVar8->pArray == (char *)0x0) {
                  pcVar9 = (char *)malloc(sVar10);
                }
                else {
                  pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
                }
                pVVar8->pArray = pcVar9;
                pVVar8->nCap = (int)sVar10;
              }
            }
            else {
              pcVar9 = pVVar8->pArray;
            }
            iVar6 = pVVar8->nSize;
            pVVar8->nSize = iVar6 + 1;
            pcVar9[iVar6] = cVar1;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          sprintf((char *)&local_f8,"%-16s",pRepr->pName);
          sVar10 = strlen((char *)&local_f8);
          if (0 < (int)(uint)sVar10) {
            uVar19 = 0;
            do {
              cVar1 = *(char *)((long)&local_f8.pName + uVar19);
              uVar2 = pVVar8->nSize;
              if (uVar2 == pVVar8->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar2 * 2;
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar8->pArray,sVar5);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = (int)sVar5;
                }
              }
              else {
                pcVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              pcVar9[iVar6] = cVar1;
              uVar19 = uVar19 + 1;
            } while (((uint)sVar10 & 0x7fffffff) != uVar19);
          }
          uVar2 = pVVar8->nSize;
          if (uVar2 == pVVar8->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = 0x10;
            }
            else {
              sVar10 = (ulong)uVar2 * 2;
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = (int)sVar10;
            }
          }
          else {
            pcVar9 = pVVar8->pArray;
          }
          iVar6 = pVVar8->nSize;
          pVVar8->nSize = iVar6 + 1;
          pcVar9[iVar6] = ' ';
          sprintf((char *)&local_f8,"%7.2f",(double)pRepr->area);
          sVar10 = strlen((char *)&local_f8);
          if (0 < (int)(uint)sVar10) {
            uVar19 = 0;
            do {
              cVar1 = *(char *)((long)&local_f8.pName + uVar19);
              uVar2 = pVVar8->nSize;
              if (uVar2 == pVVar8->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar2 * 2;
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar8->pArray,sVar5);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = (int)sVar5;
                }
              }
              else {
                pcVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              pcVar9[iVar6] = cVar1;
              uVar19 = uVar19 + 1;
            } while (((uint)sVar10 & 0x7fffffff) != uVar19);
          }
          uVar2 = pVVar8->nSize;
          if (uVar2 == pVVar8->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = 0x10;
            }
            else {
              sVar10 = (ulong)uVar2 * 2;
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = (int)sVar10;
            }
          }
          else {
            pcVar9 = pVVar8->pArray;
          }
          iVar6 = pVVar8->nSize;
          pVVar8->nSize = iVar6 + 1;
          pcVar9[iVar6] = ' ';
          iVar6 = pRepr->n_inputs;
          if (((long)iVar6 < 0) || ((pRepr->vPins).nSize <= iVar6)) {
LAB_003f3f72:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar9 = *(pRepr->vPins).pArray[iVar6];
          sVar10 = strlen(pcVar9);
          if (0 < (int)(uint)sVar10) {
            uVar19 = 0;
            do {
              cVar1 = pcVar9[uVar19];
              uVar2 = pVVar8->nSize;
              if (uVar2 == pVVar8->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar8->pArray,0x10);
                  }
                  pVVar8->pArray = pcVar11;
                  pVVar8->nCap = 0x10;
                }
                else {
                  sVar5 = (ulong)uVar2 * 2;
                  if (pVVar8->pArray == (char *)0x0) {
                    pcVar11 = (char *)malloc(sVar5);
                  }
                  else {
                    pcVar11 = (char *)realloc(pVVar8->pArray,sVar5);
                  }
                  pVVar8->pArray = pcVar11;
                  pVVar8->nCap = (int)sVar5;
                }
              }
              else {
                pcVar11 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              pcVar11[iVar6] = cVar1;
              uVar19 = uVar19 + 1;
            } while (((uint)sVar10 & 0x7fffffff) != uVar19);
          }
          uVar2 = pVVar8->nSize;
          if (uVar2 == pVVar8->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = 0x10;
            }
            else {
              sVar10 = (ulong)uVar2 * 2;
              if (pVVar8->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar10);
              }
              else {
                pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
              }
              pVVar8->pArray = pcVar9;
              pVVar8->nCap = (int)sVar10;
            }
          }
          else {
            pcVar9 = pVVar8->pArray;
          }
          iVar6 = pVVar8->nSize;
          pVVar8->nSize = iVar6 + 1;
          pcVar9[iVar6] = '=';
          iVar6 = pRepr->n_inputs;
          if (((long)iVar6 < 0) || ((pRepr->vPins).nSize <= iVar6)) goto LAB_003f3f72;
          pSVar18 = *(SC_Lib **)((long)(pRepr->vPins).pArray[iVar6] + 0x28);
          if (pSVar18 == (SC_Lib *)0x0) {
            pSVar18 = (SC_Lib *)0x90aea0;
          }
          p_00 = pSVar18;
          sVar10 = strlen((char *)pSVar18);
          if (0 < (int)(uint)sVar10) {
            uVar19 = 0;
            do {
              cVar1 = *(char *)((long)&pSVar18->pName + uVar19);
              uVar2 = pVVar8->nSize;
              if (uVar2 == pVVar8->nCap) {
                if ((int)uVar2 < 0x10) {
                  p_00 = (SC_Lib *)pVVar8->pArray;
                  if (p_00 == (SC_Lib *)0x0) {
                    p_00 = (SC_Lib *)&DAT_00000010;
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(p_00,0x10);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  __size = (SC_Lib *)((ulong)uVar2 * 2);
                  p_00 = (SC_Lib *)pVVar8->pArray;
                  if (p_00 == (SC_Lib *)0x0) {
                    p_00 = __size;
                    pcVar9 = (char *)malloc((size_t)__size);
                  }
                  else {
                    pcVar9 = (char *)realloc(p_00,(size_t)__size);
                  }
                  pVVar8->pArray = pcVar9;
                  pVVar8->nCap = (int)__size;
                }
              }
              else {
                pcVar9 = pVVar8->pArray;
              }
              iVar6 = pVVar8->nSize;
              pVVar8->nSize = iVar6 + 1;
              pcVar9[iVar6] = cVar1;
              uVar19 = uVar19 + 1;
            } while (((uint)sVar10 & 0x7fffffff) != uVar19);
          }
          lVar14 = 0;
          do {
            cVar1 = " ) ;\n"[lVar14 + 3];
            uVar2 = pVVar8->nSize;
            if (uVar2 == pVVar8->nCap) {
              if ((int)uVar2 < 0x10) {
                p_00 = (SC_Lib *)pVVar8->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = (SC_Lib *)&DAT_00000010;
                  pcVar9 = (char *)malloc(0x10);
                }
                else {
                  pcVar9 = (char *)realloc(p_00,0x10);
                }
                pVVar8->pArray = pcVar9;
                pVVar8->nCap = 0x10;
              }
              else {
                pSVar18 = (SC_Lib *)((ulong)uVar2 * 2);
                p_00 = (SC_Lib *)pVVar8->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = pSVar18;
                  pcVar9 = (char *)malloc((size_t)pSVar18);
                }
                else {
                  pcVar9 = (char *)realloc(p_00,(size_t)pSVar18);
                }
                pVVar8->pArray = pcVar9;
                pVVar8->nCap = (int)pSVar18;
              }
            }
            else {
              pcVar9 = pVVar8->pArray;
            }
            iVar6 = pVVar8->nSize;
            pVVar8->nSize = iVar6 + 1;
            pcVar9[iVar6] = cVar1;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 2);
          if (0 < pRepr->n_inputs) {
            lVar14 = 0;
            do {
              if ((pRepr->vPins).nSize <= lVar14) goto LAB_003f3f72;
              puVar4 = (undefined8 *)(pRepr->vPins).pArray[lVar14];
              fVar21 = Abc_SclComputeDelayClassPin(p_00,pRepr,(int)lVar14,Slew,Gain);
              if (fVar21 <= 0.0) {
                __assert_fail("Delay > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                              ,0x3d3,
                              "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                             );
              }
              lVar20 = 0;
              do {
                cVar1 = "         PIN "[lVar20];
                uVar2 = pVVar8->nSize;
                if (uVar2 == pVVar8->nCap) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar8->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
                    }
                    pVVar8->pArray = pcVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    sVar10 = (ulong)uVar2 * 2;
                    if (pVVar8->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(sVar10);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
                    }
                    pVVar8->pArray = pcVar9;
                    pVVar8->nCap = (int)sVar10;
                  }
                }
                else {
                  pcVar9 = pVVar8->pArray;
                }
                iVar6 = pVVar8->nSize;
                pVVar8->nSize = iVar6 + 1;
                pcVar9[iVar6] = cVar1;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 0xd);
              sprintf((char *)&local_f8,"%-4s",*puVar4);
              sVar10 = strlen((char *)&local_f8);
              if (0 < (int)(uint)sVar10) {
                uVar19 = 0;
                do {
                  cVar1 = *(char *)((long)&local_f8.pName + uVar19);
                  uVar2 = pVVar8->nSize;
                  if (uVar2 == pVVar8->nCap) {
                    if ((int)uVar2 < 0x10) {
                      if (pVVar8->pArray == (char *)0x0) {
                        pcVar9 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
                      }
                      pVVar8->pArray = pcVar9;
                      pVVar8->nCap = 0x10;
                    }
                    else {
                      sVar5 = (ulong)uVar2 * 2;
                      if (pVVar8->pArray == (char *)0x0) {
                        pcVar9 = (char *)malloc(sVar5);
                      }
                      else {
                        pcVar9 = (char *)realloc(pVVar8->pArray,sVar5);
                      }
                      pVVar8->pArray = pcVar9;
                      pVVar8->nCap = (int)sVar5;
                    }
                  }
                  else {
                    pcVar9 = pVVar8->pArray;
                  }
                  iVar6 = pVVar8->nSize;
                  pVVar8->nSize = iVar6 + 1;
                  pcVar9[iVar6] = cVar1;
                  uVar19 = uVar19 + 1;
                } while (((uint)sVar10 & 0x7fffffff) != uVar19);
              }
              p_00 = &local_f8;
              sprintf((char *)p_00," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar21,
                      SUB84((double)fVar21,0));
              sVar10 = strlen((char *)p_00);
              if (0 < (int)(uint)sVar10) {
                uVar19 = 0;
                do {
                  cVar1 = *(char *)((long)&local_f8.pName + uVar19);
                  uVar2 = pVVar8->nSize;
                  if (uVar2 == pVVar8->nCap) {
                    if ((int)uVar2 < 0x10) {
                      p_00 = (SC_Lib *)pVVar8->pArray;
                      if (p_00 == (SC_Lib *)0x0) {
                        p_00 = (SC_Lib *)&DAT_00000010;
                        pcVar9 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar9 = (char *)realloc(p_00,0x10);
                      }
                      pVVar8->pArray = pcVar9;
                      pVVar8->nCap = 0x10;
                    }
                    else {
                      pSVar18 = (SC_Lib *)((ulong)uVar2 * 2);
                      p_00 = (SC_Lib *)pVVar8->pArray;
                      if (p_00 == (SC_Lib *)0x0) {
                        p_00 = pSVar18;
                        pcVar9 = (char *)malloc((size_t)pSVar18);
                      }
                      else {
                        pcVar9 = (char *)realloc(p_00,(size_t)pSVar18);
                      }
                      pVVar8->pArray = pcVar9;
                      pVVar8->nCap = (int)pSVar18;
                    }
                  }
                  else {
                    pcVar9 = pVVar8->pArray;
                  }
                  iVar6 = pVVar8->nSize;
                  pVVar8->nSize = iVar6 + 1;
                  pcVar9[iVar6] = cVar1;
                  uVar19 = uVar19 + 1;
                } while (((uint)sVar10 & 0x7fffffff) != uVar19);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pRepr->n_inputs);
          }
          iVar17 = iVar17 + 1;
        }
      }
LAB_003f3e30:
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vCells).nSize);
  }
  lVar7 = 0;
  do {
    cVar1 = "\n.end\n"[lVar7];
    uVar2 = pVVar8->nSize;
    if (uVar2 == pVVar8->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = 0x10;
      }
      else {
        sVar10 = (ulong)uVar2 * 2;
        if (pVVar8->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar10);
        }
        else {
          pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
        }
        pVVar8->pArray = pcVar9;
        pVVar8->nCap = (int)sVar10;
      }
    }
    else {
      pcVar9 = pVVar8->pArray;
    }
    iVar6 = pVVar8->nSize;
    pVVar8->nSize = iVar6 + 1;
    pcVar9[iVar6] = cVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  uVar2 = pVVar8->nSize;
  if (uVar2 == pVVar8->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar8->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(pVVar8->pArray,0x10);
      }
      pVVar8->pArray = pcVar9;
      pVVar8->nCap = 0x10;
    }
    else {
      sVar10 = (ulong)uVar2 * 2;
      if (pVVar8->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar10);
      }
      else {
        pcVar9 = (char *)realloc(pVVar8->pArray,sVar10);
      }
      pVVar8->pArray = pcVar9;
      pVVar8->nCap = (int)sVar10;
    }
  }
  else {
    pcVar9 = pVVar8->pArray;
  }
  iVar6 = pVVar8->nSize;
  pVVar8->nSize = iVar6 + 1;
  pcVar9[iVar6] = '\0';
  if (pnCellCount != (int *)0x0) {
    *pnCellCount = iVar17;
  }
  return pVVar8;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrProfile( SC_Lib * p, Mio_Library_t * pLib, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        // check if the gate is in the profile
        if ( pRepr->n_inputs > 1 )
        {
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pRepr->pName, NULL );
            if ( pGate == NULL || Mio_GateReadProfile(pGate) == 0 )
                continue;
        }
        // process gate
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}